

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_pickups.cpp
# Opt level: O0

void __thiscall AInventory::DepleteOrDestroy(AInventory *this)

{
  AInventory *this_local;
  
  if ((this->ItemFlags & 0x2000) == 0) {
    (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
  }
  else {
    this->Amount = 0;
  }
  return;
}

Assistant:

void AInventory::DepleteOrDestroy ()
{
	// If it's not ammo or an internal armor, destroy it.
	// Ammo needs to stick around, even when it's zero for the benefit
	// of the weapons that use it and to maintain the maximum ammo
	// amounts a backpack might have given.
	// Armor shouldn't be removed because they only work properly when
	// they are the last items in the inventory.
	if (ItemFlags & IF_KEEPDEPLETED)
	{
		Amount = 0;
	}
	else
	{
		Destroy();
	}
}